

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.hpp
# Opt level: O2

void __thiscall
Omega_h::Children::Children(Children *this,LOs *a2ab_,LOs *ab2b_,Read<signed_char> *codes_)

{
  Write<int> WStack_38;
  Write<int> local_28;
  
  Write<int>::Write(&local_28,&a2ab_->write_);
  Write<int>::Write(&WStack_38,&ab2b_->write_);
  Graph::Graph(&this->super_Graph,(LOs *)&local_28,(LOs *)&WStack_38);
  Write<int>::~Write(&WStack_38);
  Write<int>::~Write(&local_28);
  Write<signed_char>::Write(&(this->codes).write_,&codes_->write_);
  return;
}

Assistant:

Children(LOs a2ab_, LOs ab2b_, Read<I8> codes_)
      : Graph(a2ab_, ab2b_), codes(codes_) {}